

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

int libssh2_sftp_posix_rename_ex
              (LIBSSH2_SFTP *sftp,char *source_filename,size_t source_filename_len,
              char *dest_filename,size_t dest_filename_len)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  size_t sVar2;
  int iVar3;
  uint32_t uVar4;
  time_t start_time;
  ulong uVar5;
  uchar *buf;
  ulong uVar6;
  char *pcVar7;
  uchar *local_78;
  uchar *s;
  uint32_t local_64;
  size_t local_60;
  size_t data_len;
  char *local_50;
  size_t local_48;
  char *local_40;
  size_t local_38;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    return -0x27;
  }
  local_50 = source_filename;
  local_40 = dest_filename;
  start_time = time((time_t *)0x0);
  local_60 = source_filename_len + dest_filename_len + 0x2d;
  uVar5 = dest_filename_len | source_filename_len | local_60;
  local_64 = (int)local_60 - 4;
  local_48 = source_filename_len;
  local_38 = dest_filename_len;
  do {
    channel = sftp->channel;
    pLVar1 = channel->session;
    data_len = 0;
    local_78 = (uchar *)0x0;
    if (sftp->posix_rename_version == 1) {
      if (uVar5 >> 0x20 != 0) {
        iVar3 = -0x29;
        pcVar7 = "Input too largeposix-rename@openssh.com";
        goto LAB_00124c3d;
      }
      if (sftp->posix_rename_state == libssh2_NB_state_idle) {
        buf = (uchar *)(*pLVar1->alloc)(local_60,&pLVar1->abstract);
        if (buf != (uchar *)0x0) {
          s = buf;
          _libssh2_store_u32(&s,local_64);
          *s = 200;
          uVar4 = sftp->request_id;
          sftp->request_id = uVar4 + 1;
          sftp->posix_rename_request_id = uVar4;
          s = s + 1;
          _libssh2_store_u32(&s,uVar4);
          _libssh2_store_str(&s,"posix-rename@openssh.com",0x18);
          _libssh2_store_str(&s,local_50,local_48);
          _libssh2_store_str(&s,local_40,local_38);
          sftp->posix_rename_state = libssh2_NB_state_created;
          goto LAB_00124d35;
        }
        iVar3 = -6;
        pcVar7 = "Unable to allocate memory for FXP_EXTENDED packet";
        s = (uchar *)0x0;
LAB_00124e7e:
        iVar3 = _libssh2_error(pLVar1,iVar3,pcVar7);
        goto LAB_00124c42;
      }
      if (sftp->posix_rename_state != libssh2_NB_state_created) {
LAB_00124da9:
        iVar3 = sftp_packet_require(sftp,'e',sftp->posix_rename_request_id,&local_78,&data_len,9);
        if (iVar3 == 0) {
          sftp->posix_rename_state = libssh2_NB_state_idle;
          uVar4 = _libssh2_ntohu32(local_78 + 5);
          (*pLVar1->free)(local_78,&pLVar1->abstract);
          if (uVar4 == 0) {
            return 0;
          }
          sftp->last_errno = uVar4;
          iVar3 = -0x1f;
          pcVar7 = "posix_rename failed";
        }
        else {
          if (iVar3 == -0x25) goto LAB_00124c4b;
          if (iVar3 == -0x26) {
            if (data_len != 0) {
              (*pLVar1->free)(local_78,&pLVar1->abstract);
            }
            iVar3 = -0x1f;
            pcVar7 = "SFTP posix_rename packet too short";
          }
          else {
            sftp->posix_rename_state = libssh2_NB_state_idle;
            pcVar7 = "Error waiting for FXP EXTENDED REPLY";
          }
        }
        goto LAB_00124c3d;
      }
      buf = sftp->posix_rename_packet;
LAB_00124d35:
      sVar2 = local_60;
      uVar6 = _libssh2_channel_write(channel,0,buf,local_60);
      if (uVar6 != 0xffffffffffffffdb && sVar2 <= uVar6) {
        (*pLVar1->free)(buf,&pLVar1->abstract);
        sftp->posix_rename_packet = (uchar *)0x0;
        if ((long)uVar6 < 0) {
          sftp->posix_rename_state = libssh2_NB_state_idle;
          iVar3 = -7;
          pcVar7 = "_libssh2_channel_write() failed";
          goto LAB_00124e7e;
        }
        sftp->posix_rename_state = libssh2_NB_state_sent;
        goto LAB_00124da9;
      }
      sftp->posix_rename_packet = buf;
    }
    else {
      iVar3 = 8;
      pcVar7 = "Server does not supportposix-rename@openssh.com";
LAB_00124c3d:
      iVar3 = _libssh2_error(pLVar1,iVar3,pcVar7);
LAB_00124c42:
      if (iVar3 != -0x25) {
        return iVar3;
      }
    }
LAB_00124c4b:
    pLVar1 = sftp->channel->session;
    if ((pLVar1 == (LIBSSH2_SESSION *)0x0) || (pLVar1->api_block_mode == 0)) {
      return -0x25;
    }
    iVar3 = _libssh2_wait_socket(pLVar1,start_time);
    if (iVar3 != 0) {
      return iVar3;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_sftp_posix_rename_ex(LIBSSH2_SFTP *sftp, const char *source_filename,
                             size_t source_filename_len,
                             const char *dest_filename,
                             size_t dest_filename_len)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_posix_rename(sftp, source_filename, source_filename_len,
                                   dest_filename, dest_filename_len));
    return rc;
}